

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O0

string * __thiscall
wabt::operator+[abi_cxx11_(string *__return_storage_ptr__,wabt *this,string_view x,string_view y)

{
  const_pointer pvVar1;
  undefined1 local_30 [8];
  string_view y_local;
  string_view x_local;
  string *s;
  
  y_local._M_len = y._M_len;
  local_30 = (undefined1  [8])x._M_str;
  y_local._M_str = (char *)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)&y_local._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&y_local._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)&y_local._M_str);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pvVar1);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pvVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator+(std::string_view x, std::string_view y) {
  std::string s;
  s.reserve(x.size() + y.size());
  s.append(x.data(), x.size());
  s.append(y.data(), y.size());
  return s;
}